

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateInlineMethods
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  int local_1c;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Descriptor::nested_type_count(this->descriptor_);
    if (iVar1 <= local_1c) break;
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
              ::operator[](&this->nested_generators_,(long)local_1c);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                        (this_00);
    GenerateInlineMethods(this_01,printer);
    io::Printer::Print(printer,
                       "// -------------------------------------------------------------------\n");
    io::Printer::Print(printer,"\n");
    local_1c = local_1c + 1;
  }
  GenerateFieldAccessorDefinitions(this,printer);
  return;
}

Assistant:

void MessageGenerator::
GenerateInlineMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateInlineMethods(printer);
    printer->Print(kThinSeparator);
    printer->Print("\n");
  }

  GenerateFieldAccessorDefinitions(printer);
}